

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O2

bool __thiscall
JitFFI::SysV64::ArgOPList::do_next
          (ArgOPList *this,function<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int)> *f)

{
  bool bVar1;
  Data data;
  Data local_1c;
  
  bVar1 = StackList<JitFFI::SysV64::ArgOPList::Data>::get_next(&this->datalist,&local_1c);
  if (bVar1) {
    std::function<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int)>::operator()
              (f,local_1c.op,local_1c.num);
  }
  return bVar1;
}

Assistant:

bool do_next(const std::function<void(ArgTypeInfo::OP, unsigned int num)> &f) {
				Data data;
				bool v = datalist.get_next(data);
				if (v == false)
					return false;
				f(data.op, data.num);
				return true;
			}